

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-slice.cc
# Opt level: O1

TextSlice * __thiscall
TextSlice::prefix(TextSlice *__return_storage_ptr__,TextSlice *this,uint32_t prefix_end)

{
  Point PVar1;
  Point PVar2;
  Point local_28;
  Point local_20;
  
  local_20 = position_for_offset(this,prefix_end,0);
  local_28 = Point::traverse(&this->start_position,&local_20);
  PVar2 = Point::min(&this->end_position,&local_28);
  PVar1 = this->start_position;
  __return_storage_ptr__->text = this->text;
  __return_storage_ptr__->start_position = PVar1;
  __return_storage_ptr__->end_position = PVar2;
  return __return_storage_ptr__;
}

Assistant:

TextSlice TextSlice::prefix(uint32_t prefix_end) const {
  return split(prefix_end).first;
}